

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O1

Vec_Str_t * Abc_NtkRRSimulate(Abc_Ntk_t *pNtk)

{
  size_t __n;
  int iVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Str_t *vTargets;
  char *__s;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  Vec_Ptr_t *pVVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  
  iVar1 = pNtk->vObjs->nSize;
  __n = (long)iVar1 + 1;
  vTargets = (Vec_Str_t *)malloc(0x10);
  iVar7 = (int)__n;
  iVar6 = 0x10;
  if (0xe < (ulong)(long)iVar1) {
    iVar6 = iVar7;
  }
  vTargets->nSize = 0;
  vTargets->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar6);
  }
  vTargets->pArray = __s;
  vTargets->nSize = iVar7;
  memset(__s,0,__n);
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar10->pArray[lVar15];
      if ((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) {
        iVar6 = (int)plVar2[2];
        if (((long)iVar6 < 0) || (iVar1 < iVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        __s[iVar6] = 1 < *(int *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x2c) |
                     (1 < *(int *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x2c)) *
                     '\x02';
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar10->nSize);
  }
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0xffffffff;
  pVVar10 = pNtk->vCis;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar15];
      iVar6 = rand();
      iVar7 = rand();
      uVar8 = rand();
      *(ulong *)((long)pvVar4 + 0x40) = (ulong)(uVar8 ^ iVar7 << 0xc ^ iVar6 << 0x18);
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vCis;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar10->pArray[lVar15];
      if (((plVar2 != (long *)0x0) && (lVar15 != 0)) &&
         (uVar8 = *(uint *)((long)plVar2 + 0x14), (uVar8 & 0xf) == 7)) {
        lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        plVar2[8] = (ulong)(((int)(uVar8 << 0x14) >> 0x1f ^
                            *(uint *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x38)) &
                           ((int)(uVar8 << 0x15) >> 0x1f ^
                           *(uint *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x38)));
      }
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vCos;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar10->pArray[lVar15];
      uVar16 = (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)plVar2[4] * 8) + 0x38);
      uVar19 = uVar16 ^ 0xffffffff;
      if ((*(uint *)((long)plVar2 + 0x14) >> 10 & 1) == 0) {
        uVar19 = uVar16;
      }
      plVar2[7] = uVar19;
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vCos;
    } while (lVar15 < pVVar10->nSize);
  }
  if (0 < pNtk->vCis->nSize) {
    uVar19 = 0;
    do {
      pVVar10 = (Vec_Ptr_t *)malloc(0x10);
      pVVar10->nCap = 10;
      pVVar10->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pVVar10->pArray = ppvVar11;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar6 = pNtk->vObjs->nSize;
        uVar16 = (long)iVar6 + 500;
        iVar7 = (int)uVar16;
        if ((pNtk->vTravIds).nCap < iVar7) {
          piVar12 = (int *)malloc(uVar16 * 4);
          (pNtk->vTravIds).pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_0029ebee;
          (pNtk->vTravIds).nCap = iVar7;
        }
        if (-500 < iVar6) {
          memset((pNtk->vTravIds).pArray,0,(uVar16 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar7;
      }
      iVar6 = pNtk->nTravIds;
      pNtk->nTravIds = iVar6 + 1;
      if (0x3ffffffe < iVar6) {
LAB_0029ebcf:
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      pVVar13 = pNtk->vCis;
      iVar6 = (int)uVar19;
      if (iVar6 < pVVar13->nSize) {
        do {
          if (iVar6 < 0) goto LAB_0029ebb0;
          Sim_TraverseNodes_rec((Abc_Obj_t *)pVVar13->pArray[uVar19],vTargets,pVVar10);
          if (0x80 < pVVar10->nSize) break;
          uVar19 = uVar19 + 1;
          pVVar13 = pNtk->vCis;
        } while ((int)uVar19 < pVVar13->nSize);
        uVar19 = uVar19 & 0xffffffff;
      }
      pVVar13 = (Vec_Ptr_t *)malloc(0x10);
      pVVar13->nCap = 10;
      pVVar13->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pVVar13->pArray = ppvVar11;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar6 = pNtk->vObjs->nSize;
        uVar16 = (long)iVar6 + 500;
        iVar7 = (int)uVar16;
        if ((pNtk->vTravIds).nCap < iVar7) {
          piVar12 = (int *)malloc(uVar16 * 4);
          (pNtk->vTravIds).pArray = piVar12;
          if (piVar12 == (int *)0x0) {
LAB_0029ebee:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pNtk->vTravIds).nCap = iVar7;
        }
        if (-500 < iVar6) {
          memset((pNtk->vTravIds).pArray,0,(uVar16 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar7;
      }
      iVar6 = pNtk->nTravIds;
      pNtk->nTravIds = iVar6 + 1;
      if (0x3ffffffe < iVar6) goto LAB_0029ebcf;
      pVVar14 = pNtk->vCos;
      if (0 < pVVar14->nSize) {
        lVar15 = 0;
        do {
          Sim_CollectNodes_rec((Abc_Obj_t *)pVVar14->pArray[lVar15],pVVar13);
          lVar15 = lVar15 + 1;
          pVVar14 = pNtk->vCos;
        } while (lVar15 < pVVar14->nSize);
      }
      iVar6 = pVVar13->nSize;
      uVar8 = pVVar10->nSize;
      uVar16 = (ulong)uVar8;
      pVVar14 = Sim_UtilInfoAlloc(iVar6,uVar8,0);
      if (0 < (long)iVar6) {
        ppvVar11 = pVVar13->pArray;
        lVar15 = 0;
        do {
          plVar2 = (long *)ppvVar11[lVar15];
          uVar17 = *(uint *)((long)plVar2 + 0x14) & 0xf;
          if ((uVar17 == 5) || (uVar17 == 2)) {
            if (pVVar14->nSize <= lVar15) goto LAB_0029ebb0;
            if (0 < (int)uVar8) {
              pvVar4 = pVVar14->pArray[lVar15];
              uVar18 = 0;
              do {
                *(int *)((long)pvVar4 + uVar18 * 4) = (int)plVar2[8];
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
          }
          else if (0xfffffffd < uVar17 - 5) {
            if (((pVVar14->nSize <= lVar15) ||
                (uVar17 = (uint)*(undefined8 *)
                                 (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x38), (int)uVar17 < 0))
               || (pVVar14->nSize <= (int)uVar17)) {
LAB_0029ebb0:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar4 = pVVar14->pArray[lVar15];
            pvVar5 = pVVar14->pArray[uVar17 & 0x7fffffff];
            if ((*(uint *)((long)plVar2 + 0x14) >> 10 & 1) == 0) {
              if (0 < (int)uVar8) {
                uVar18 = 0;
                do {
                  *(undefined4 *)((long)pvVar4 + uVar18 * 4) =
                       *(undefined4 *)((long)pvVar5 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar16 != uVar18);
              }
            }
            else if (0 < (int)uVar8) {
              uVar18 = 0;
              do {
                *(uint *)((long)pvVar4 + uVar18 * 4) = ~*(uint *)((long)pvVar5 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            if (0 < (int)uVar8) {
              uVar18 = 0;
              do {
                if (*(int *)((long)pvVar4 + uVar18 * 4) != (int)plVar2[7]) {
                  iVar7 = *(int *)(((ulong)pVVar10->pArray[uVar18] & 0xfffffffffffffffe) + 0x10);
                  if (((long)iVar7 < 0) || (iVar1 < iVar7)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                  }
                  __s[iVar7] = __s[iVar7] & ((byte)pVVar10->pArray[uVar18] & 1) + 1;
                }
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != iVar6);
      }
      if (pVVar10->pArray != (void **)0x0) {
        free(pVVar10->pArray);
        pVVar10->pArray = (void **)0x0;
      }
      free(pVVar10);
    } while ((int)uVar19 < pNtk->vCis->nSize);
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      if (pVVar10->pArray[lVar15] != (void *)0x0) {
        *(undefined8 *)((long)pVVar10->pArray[lVar15] + 0x38) = 0;
      }
      lVar15 = lVar15 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar15 < pVVar10->nSize);
  }
  return vTargets;
}

Assistant:

Vec_Str_t * Abc_NtkRRSimulate( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vField;
    Vec_Str_t * vTargets;
    Abc_Obj_t * pObj;
    unsigned uData, uData0, uData1;
    int PrevCi, Phase, i, k;

    // start the candidates
    vTargets = Vec_StrStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Phase = ((Abc_ObjFanoutNum(Abc_ObjFanin1(pObj)) > 1) << 1);
        Phase |= (Abc_ObjFanoutNum(Abc_ObjFanin0(pObj)) > 1);
        Vec_StrWriteEntry( vTargets, pObj->Id, (char)Phase );
    }

    // simulate patters and store them in copy
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)~((unsigned)0);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)SIM_RANDOM_UNSIGNED;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        uData1 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pData;
        uData  = Abc_ObjFaninC0(pObj)? ~uData0 : uData0;
        uData &= Abc_ObjFaninC1(pObj)? ~uData1 : uData1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)uData;
    }
    // store the result in data
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        if ( Abc_ObjFaninC0(pObj) )
            pObj->pData = (void *)(ABC_PTRUINT_T)~uData0;
        else
            pObj->pData = (void *)(ABC_PTRUINT_T)uData0;
    }

    // refine the candidates
    for ( PrevCi = 0; PrevCi < Abc_NtkCiNum(pNtk); PrevCi = i )
    {
        vNodes = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        for ( i = PrevCi; i < Abc_NtkCiNum(pNtk); i++ )
        {
            Sim_TraverseNodes_rec( Abc_NtkCi(pNtk, i), vTargets, vNodes );
            if ( Vec_PtrSize(vNodes) > 128 )
                break;
        }
        // collect the marked nodes in the topological order
        vField = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        Abc_NtkForEachCo( pNtk, pObj, k )
            Sim_CollectNodes_rec( pObj, vField );

        // simulate these nodes
        Sim_SimulateCollected( vTargets, vNodes, vField );
        // prepare for the next loop
        Vec_PtrFree( vNodes );
    }

    // clean
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pData = NULL;
    return vTargets;
}